

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-gui.cpp
# Opt level: O0

void Gui::free(void *__ptr)

{
  ImGui_ImplOpenGL3_Shutdown();
  ImGui_ImplSDL2_Shutdown();
  ImGui::DestroyContext((ImGuiContext *)0x1e1d08);
  SDL_GL_DeleteContext(*(undefined8 *)((long)__ptr + 8));
  SDL_DestroyWindow(*__ptr);
  SDL_Quit();
  return;
}

Assistant:

bool free(const Objects & objects) {
    ImGui_ImplOpenGL3_Shutdown();
    ImGui_ImplSDL2_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(objects.gl_context);
    SDL_DestroyWindow(objects.window);
    SDL_Quit();

    return true;
}